

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ThreadContext.cpp
# Opt level: O3

void __thiscall ThreadContext::LeaveScriptStart<false>(ThreadContext *this,void *frameAddress)

{
  ScriptEntryExitRecord *pSVar1;
  code *pcVar2;
  bool bVar3;
  DWORD DVar4;
  undefined4 *puVar5;
  
  if (this->isScriptActive == false) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar5 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/ThreadContext.cpp"
                       ,0x6f8,"(this->IsScriptActive())","this->IsScriptActive()");
    if (!bVar3) goto LAB_007b85c2;
    *puVar5 = 0;
  }
  bVar3 = Js::Phases::IsEnabled((Phases *)&DAT_015b6718,RunPhase);
  if (bVar3) {
    DVar4 = GetCurrentThreadId();
    Output::Trace(RunPhase,L"%p> LeaveScriptStart(%p): Level %d\n",(ulong)DVar4,this,
                  (ulong)this->callRootLevel);
    Output::Flush();
  }
  pSVar1 = this->entryExitRecord;
  if ((pSVar1 == (ScriptEntryExitRecord *)0x0) ||
     (pSVar1->frameIdOfScriptExitFunction != (void *)0x0)) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar5 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/ThreadContext.cpp"
                       ,0x705,
                       "(entryExitRecord && entryExitRecord->frameIdOfScriptExitFunction == nullptr)"
                       ,"Missing LeaveScriptEnd or EnterScriptStart");
    if (!bVar3) {
LAB_007b85c2:
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar5 = 0;
  }
  pSVar1->frameIdOfScriptExitFunction = frameAddress;
  this->isScriptActive = false;
  Memory::Recycler::SetIsScriptActive(this->recycler,false);
  pSVar1->savedImplicitCallFlags = this->implicitCallFlags;
  *(byte *)pSVar1 = *(byte *)pSVar1 & 0xe5;
  return;
}

Assistant:

void
ThreadContext::LeaveScriptStart(void * frameAddress)
{
    Assert(this->IsScriptActive());

#if DBG_DUMP
    if (Js::Configuration::Global.flags.Trace.IsEnabled(Js::RunPhase))
    {
        Output::Trace(Js::RunPhase, _u("%p> LeaveScriptStart(%p): Level %d\n"), ::GetCurrentThreadId(), this, this->callRootLevel);
        Output::Flush();
    }
#endif

    Js::ScriptEntryExitRecord * entryExitRecord = this->GetScriptEntryExit();

    AssertMsg(entryExitRecord && entryExitRecord->frameIdOfScriptExitFunction == nullptr,
              "Missing LeaveScriptEnd or EnterScriptStart");

    entryExitRecord->frameIdOfScriptExitFunction = frameAddress;

    this->isScriptActive = false;
    this->GetRecycler()->SetIsScriptActive(false);

    AssertMsg(!(leaveForHost && this->IsDisableImplicitCall()),
        "Disable implicit call should have been caught before leaving script for host");

    // Save the implicit call flags
    entryExitRecord->savedImplicitCallFlags = this->GetImplicitCallFlags();

    // clear the hasReentered to detect if we have reentered into script
    entryExitRecord->hasReentered = false;
#if DBG || defined(PROFILE_EXEC)
    entryExitRecord->leaveForHost = leaveForHost;
#endif
#if DBG
    entryExitRecord->leaveForAsyncHostOperation = false;
#endif

#ifdef PROFILE_EXEC
    if (leaveForHost)
    {
        entryExitRecord->scriptContext->ProfileEnd(Js::RunPhase);
    }
#endif
}